

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cc
# Opt level: O1

void __thiscall
tchecker::algorithms::reach::stats_t::attributes
          (stats_t *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *m)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint *puVar2;
  mapped_type *pmVar3;
  stringstream sstream;
  long *local_1f8 [2];
  long local_1e8 [2];
  key_type local_1d8;
  stringstream local_1b8 [16];
  long local_1a8;
  string local_1a0 [16];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  algorithms::stats_t::attributes(&this->super_stats_t,m);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  std::__cxx11::stringbuf::str();
  paVar1 = &local_1d8.field_2;
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"VISITED_STATES","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](m,&local_1d8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"");
  std::__cxx11::stringbuf::str(local_1a0);
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  std::__cxx11::stringbuf::str();
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"VISITED_TRANSITIONS","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](m,&local_1d8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"");
  std::__cxx11::stringbuf::str(local_1a0);
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  puVar2 = (uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18));
  *puVar2 = *puVar2 | 1;
  std::ostream::_M_insert<bool>(SUB81(&local_1a8,0));
  std::__cxx11::stringbuf::str();
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"REACHABLE","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](m,&local_1d8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void stats_t::attributes(std::map<std::string, std::string> & m) const
{
  tchecker::algorithms::stats_t::attributes(m);

  std::stringstream sstream;

  sstream << _visited_states;
  m["VISITED_STATES"] = sstream.str();

  sstream.str("");
  sstream << _visited_transitions;
  m["VISITED_TRANSITIONS"] = sstream.str();

  sstream.str("");
  sstream << std::boolalpha << _reachable;
  m["REACHABLE"] = sstream.str();
}